

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int add_closure_var(JSContext *ctx,JSFunctionDef *s,BOOL is_local,BOOL is_arg,int var_idx,
                   JSAtom var_name,BOOL is_const,BOOL is_lexical,JSVarKindEnum var_kind)

{
  JSClosureVar *pJVar1;
  JSAtomStruct *pJVar2;
  int iVar3;
  
  iVar3 = s->closure_var_count;
  if (iVar3 < 0x10000) {
    if (s->closure_var_size <= iVar3) {
      iVar3 = js_realloc_array(ctx,&s->closure_var,8,&s->closure_var_size,iVar3 + 1);
      if (iVar3 != 0) {
        return -1;
      }
      iVar3 = s->closure_var_count;
    }
    pJVar1 = s->closure_var;
    s->closure_var_count = iVar3 + 1;
    *(byte *)(pJVar1 + iVar3) =
         ((byte)is_lexical & 1) << 3 |
         ((byte)is_const & 1) << 2 | (char)is_arg * '\x02' & 2U | (byte)is_local & 1 |
         (char)var_kind << 4;
    pJVar1[iVar3].var_idx = (uint16_t)var_idx;
    if (0xd1 < (int)var_name) {
      pJVar2 = ctx->rt->atom_array[var_name];
      (pJVar2->header).ref_count = (pJVar2->header).ref_count + 1;
    }
    pJVar1[iVar3].var_name = var_name;
    iVar3 = s->closure_var_count + -1;
  }
  else {
    JS_ThrowInternalError(ctx,"too many closure variables");
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int add_closure_var(JSContext *ctx, JSFunctionDef *s,
                           BOOL is_local, BOOL is_arg,
                           int var_idx, JSAtom var_name,
                           BOOL is_const, BOOL is_lexical,
                           JSVarKindEnum var_kind)
{
    JSClosureVar *cv;

    /* the closure variable indexes are currently stored on 16 bits */
    if (s->closure_var_count >= JS_MAX_LOCAL_VARS) {
        JS_ThrowInternalError(ctx, "too many closure variables");
        return -1;
    }

    if (js_resize_array(ctx, (void **)&s->closure_var,
                        sizeof(s->closure_var[0]),
                        &s->closure_var_size, s->closure_var_count + 1))
        return -1;
    cv = &s->closure_var[s->closure_var_count++];
    cv->is_local = is_local;
    cv->is_arg = is_arg;
    cv->is_const = is_const;
    cv->is_lexical = is_lexical;
    cv->var_kind = var_kind;
    cv->var_idx = var_idx;
    cv->var_name = JS_DupAtom(ctx, var_name);
    return s->closure_var_count - 1;
}